

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O3

bool __thiscall
iDynTree::DiscreteKalmanFilterHelper::kfSetInitialState
          (DiscreteKalmanFilterHelper *this,VectorDynSize *x0)

{
  size_t sVar1;
  VectorDynSize *pVVar2;
  size_t sVar3;
  
  sVar3 = iDynTree::VectorDynSize::size();
  sVar1 = this->m_dim_X;
  if (sVar3 == sVar1) {
    pVVar2 = (VectorDynSize *)iDynTree::VectorDynSize::operator=(&this->m_x0,x0);
    iDynTree::VectorDynSize::operator=(&this->m_x,pVVar2);
    this->m_initial_state_set = true;
  }
  else {
    iDynTree::reportError
              ("DiscreteKalmanFilterHelper","kfSetInitialState",
               "Could not set KF initial state - dimension mismatch");
  }
  return sVar3 == sVar1;
}

Assistant:

bool iDynTree::DiscreteKalmanFilterHelper::kfSetInitialState(const iDynTree::VectorDynSize& x0)
{
    if (x0.size() != m_dim_X)
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfSetInitialState", "Could not set KF initial state - dimension mismatch");
        return false;
    }

    m_x = m_x0 = x0;
    m_initial_state_set = true;
    return true;
}